

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int parseHhMmSs(char *zDate,DateTime *p)

{
  int iVar1;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  double rScale;
  double ms;
  int s;
  int m;
  int h;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  double local_30;
  byte *local_20;
  int local_18;
  int local_14;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  local_10 = 0xaaaaaaaa;
  local_14 = -0x55555556;
  local_30 = 0.0;
  iVar1 = getDigits(in_RDI,"20c:20e",&local_c,&local_10);
  if (iVar1 == 2) {
    if (in_RDI[5] == ':') {
      iVar1 = getDigits(in_RDI + 6,"20e",&local_14);
      if (iVar1 != 1) {
        local_18 = 1;
        goto LAB_0022e830;
      }
      if ((in_RDI[8] == '.') && ((""[(byte)in_RDI[9]] & 4) != 0)) {
        in_stack_ffffffffffffffc8 = (char *)0x3ff0000000000000;
        local_20 = (byte *)(in_RDI + 9);
        while ((""[*local_20] & 4) != 0) {
          local_30 = (local_30 * 10.0 + (double)(int)(char)*local_20) - 48.0;
          in_stack_ffffffffffffffc8 = (char *)((double)in_stack_ffffffffffffffc8 * 10.0);
          local_20 = local_20 + 1;
        }
        local_30 = local_30 / (double)in_stack_ffffffffffffffc8;
        if (0.999 < local_30) {
          local_30 = 0.999;
        }
      }
    }
    else {
      local_14 = 0;
    }
    *(undefined1 *)(in_RSI + 0x28) = 0;
    *(byte *)(in_RSI + 0x2c) = *(byte *)(in_RSI + 0x2c) & 0xfe;
    *(undefined1 *)(in_RSI + 0x2a) = 1;
    *(undefined4 *)(in_RSI + 0x14) = local_c;
    *(undefined4 *)(in_RSI + 0x18) = local_10;
    *(double *)(in_RSI + 0x20) = (double)local_14 + local_30;
    iVar1 = parseTimezone(in_stack_ffffffffffffffc8,
                          (DateTime *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
    ;
    if (iVar1 == 0) {
      local_18 = 0;
    }
    else {
      local_18 = 1;
    }
  }
  else {
    local_18 = 1;
  }
LAB_0022e830:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

static int parseHhMmSs(const char *zDate, DateTime *p){
  int h, m, s;
  double ms = 0.0;
  if( getDigits(zDate, "20c:20e", &h, &m)!=2 ){
    return 1;
  }
  zDate += 5;
  if( *zDate==':' ){
    zDate++;
    if( getDigits(zDate, "20e", &s)!=1 ){
      return 1;
    }
    zDate += 2;
    if( *zDate=='.' && sqlite3Isdigit(zDate[1]) ){
      double rScale = 1.0;
      zDate++;
      while( sqlite3Isdigit(*zDate) ){
        ms = ms*10.0 + *zDate - '0';
        rScale *= 10.0;
        zDate++;
      }
      ms /= rScale;
      /* Truncate to avoid problems with sub-milliseconds
      ** rounding. https://sqlite.org/forum/forumpost/766a2c9231 */
      if( ms>0.999 ) ms = 0.999;
    }
  }else{
    s = 0;
  }
  p->validJD = 0;
  p->rawS = 0;
  p->validHMS = 1;
  p->h = h;
  p->m = m;
  p->s = s + ms;
  if( parseTimezone(zDate, p) ) return 1;
  return 0;
}